

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.h
# Opt level: O0

void __thiscall
sptk::RealValuedFastFourierTransform::~RealValuedFastFourierTransform
          (RealValuedFastFourierTransform *this)

{
  RealValuedFastFourierTransform *in_RDI;
  
  ~RealValuedFastFourierTransform(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~RealValuedFastFourierTransform() {
  }